

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionHandler.cpp
# Opt level: O2

void __thiscall
irr::video::COpenGL3ExtensionHandler::extensionsLoaded(COpenGL3ExtensionHandler *this)

{
  bool bVar1;
  size_t j;
  long lVar2;
  __node_base *p_Var3;
  double __x;
  double __x_00;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Loaded ",&local_b1);
  ::std::__cxx11::to_string(&local_50,(this->Extensions)._M_h._M_element_count);
  ::std::operator+(&local_70,&local_90,&local_50);
  ::std::operator+(&local_b0,&local_70," extensions:");
  os::Printer::log((Printer *)local_b0._M_dataplus._M_p,__x);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  p_Var3 = &(this->Extensions)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"  ",(allocator<char> *)&local_90);
    ::std::operator+(&local_b0,&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var3 + 1));
    os::Printer::log((Printer *)local_b0._M_dataplus._M_p,__x_00);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  for (lVar2 = 0; lVar2 != 0x1b; lVar2 = lVar2 + 1) {
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,
               (&COGLESCoreExtensionHandler::getFeatureString(unsigned_long)::OGLESFeatureStrings)
               [lVar2],(allocator<char> *)&local_70);
    bVar1 = queryExtension(this,&local_b0);
    (this->super_COGLESCoreExtensionHandler).FeatureAvailable[lVar2] = bVar1;
    ::std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

void COpenGL3ExtensionHandler::extensionsLoaded()
{
	os::Printer::log((std::string("Loaded ") + std::to_string(Extensions.size()) + " extensions:").c_str(), ELL_DEBUG);
	for (const auto &it : Extensions)
		os::Printer::log((std::string("  ") + it).c_str(), ELL_DEBUG);
	for (size_t j = 0; j < IRR_OGLES_Feature_Count; ++j)
		FeatureAvailable[j] = queryExtension(getFeatureString(j));
}